

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptHdrWrapper.cpp
# Opt level: O0

QString * OptHdrWrapper::translateSubsystem(QString *__return_storage_ptr__,DWORD subsystem)

{
  bool bVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  _Self local_60;
  _Self local_58;
  key_type_conflict2 local_4c [14];
  DWORD local_14;
  QString *pQStack_10;
  DWORD subsystem_local;
  
  local_14 = subsystem;
  pQStack_10 = __return_storage_ptr__;
  sVar2 = std::
          map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
          ::size(&s_subsystem);
  if (sVar2 == 0) {
    local_4c[0xd] = 0;
    pmVar3 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_subsystem,local_4c + 0xd);
    QString::operator=(pmVar3,"Unknown subsystem");
    local_4c[0xc] = 1;
    pmVar3 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_subsystem,local_4c + 0xc);
    QString::operator=(pmVar3,"Driver");
    local_4c[0xb] = 2;
    pmVar3 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_subsystem,local_4c + 0xb);
    QString::operator=(pmVar3,"Windows GUI");
    local_4c[10] = 3;
    pmVar3 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_subsystem,local_4c + 10);
    QString::operator=(pmVar3,"Windows console");
    local_4c[9] = 5;
    pmVar3 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_subsystem,local_4c + 9);
    QString::operator=(pmVar3,"OS/2 console");
    local_4c[8] = 7;
    pmVar3 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_subsystem,local_4c + 8);
    QString::operator=(pmVar3,"Posix console");
    local_4c[7] = 8;
    pmVar3 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_subsystem,local_4c + 7);
    QString::operator=(pmVar3,"Native Win9x driver");
    local_4c[6] = 9;
    pmVar3 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_subsystem,local_4c + 6);
    QString::operator=(pmVar3,"Windows CE subsystem");
    local_4c[5] = 10;
    pmVar3 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_subsystem,local_4c + 5);
    QString::operator=(pmVar3,"EFI_APPLICATION");
    local_4c[4] = 0xb;
    pmVar3 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_subsystem,local_4c + 4);
    QString::operator=(pmVar3,"EFI_BOOT_SERVICE_DRIVER");
    local_4c[3] = 0xc;
    pmVar3 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_subsystem,local_4c + 3);
    QString::operator=(pmVar3,"EFI_RUNTIME_DRIVER");
    local_4c[2] = 0xd;
    pmVar3 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_subsystem,local_4c + 2);
    QString::operator=(pmVar3,"EFI_ROM");
    local_4c[1] = 0xe;
    pmVar3 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_subsystem,local_4c + 1);
    QString::operator=(pmVar3,"XBOX");
    local_4c[0] = 0x10;
    pmVar3 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_subsystem,local_4c);
    QString::operator=(pmVar3,"WINDOWS_BOOT_APPLICATION");
  }
  local_58._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
       ::find(&s_subsystem,&local_14);
  local_60._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
       ::end(&s_subsystem);
  bVar1 = std::operator==(&local_58,&local_60);
  if (bVar1) {
    QString::QString(__return_storage_ptr__,"");
  }
  else {
    pmVar3 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_subsystem,&local_14);
    QString::QString(__return_storage_ptr__,pmVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

QString OptHdrWrapper::translateSubsystem(DWORD subsystem)
{
    if (s_subsystem.size() == 0) {
        s_subsystem[pe::SUB_UNKNOWN] = "Unknown subsystem";
        s_subsystem[pe::SUB_NATIVE] = "Driver";
        s_subsystem[pe::SUB_WINDOWS_GUI] = "Windows GUI";
        s_subsystem[pe::SUB_WINDOWS_CUI] = "Windows console";
        s_subsystem[pe::SUB_OS2_CUI] = "OS/2 console";
        s_subsystem[pe::SUB_POSIX_CUI] = "Posix console";
        s_subsystem[pe::SUB_NATIVE_WINDOWS] = "Native Win9x driver";
        s_subsystem[pe::SUB_WINDOWS_CE_GUI] = "Windows CE subsystem";
        s_subsystem[pe::SUB_EFI_APPLICATION] = "EFI_APPLICATION";
        s_subsystem[pe::SUB_EFI_BOOT_SERVICE_DRIVER] = "EFI_BOOT_SERVICE_DRIVER";
        s_subsystem[pe::SUB_EFI_RUNTIME_DRIVER] = "EFI_RUNTIME_DRIVER";
        s_subsystem[pe::SUB_EFI_ROM] = "EFI_ROM";
        s_subsystem[pe::SUB_XBOX] = "XBOX";
        s_subsystem[pe::SUB_WINDOWS_BOOT_APP] = "WINDOWS_BOOT_APPLICATION";
    }
    if (s_subsystem.find(subsystem) == s_subsystem.end()) return "";
    return s_subsystem[subsystem];
}